

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

idx_t duckdb::TemplatedUpdateNumericStatistics<unsigned_short>
                (UpdateSegment *segment,SegmentStatistics *stats,UnifiedVectorFormat *update,
                idx_t count,SelectionVector *sel)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  SelectionVector *pSVar3;
  bool bVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  idx_t iVar8;
  idx_t row_idx;
  idx_t i;
  idx_t iVar9;
  
  pdVar1 = update->data;
  if ((update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pSVar3 = update->sel;
    uVar6 = *(ushort *)((long)&(stats->statistics).stats_union + 8);
    uVar7 = *(ushort *)((long)&(stats->statistics).stats_union + 0x18);
    for (iVar8 = 0; count != iVar8; iVar8 = iVar8 + 1) {
      psVar2 = pSVar3->sel_vector;
      iVar9 = iVar8;
      if (psVar2 != (sel_t *)0x0) {
        iVar9 = (idx_t)psVar2[iVar8];
      }
      uVar5 = *(ushort *)(pdVar1 + iVar9 * 2);
      if (uVar5 <= uVar6) {
        uVar6 = uVar5;
      }
      if (uVar7 <= uVar5) {
        uVar7 = uVar5;
      }
      *(ushort *)((long)&(stats->statistics).stats_union + 8) = uVar6;
      *(ushort *)((long)&(stats->statistics).stats_union + 0x18) = uVar7;
    }
    ::std::__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> *)
               &sel->selection_data);
    sel->sel_vector = (sel_t *)0x0;
    iVar8 = count;
  }
  else {
    SelectionVector::Initialize(sel,0x800);
    iVar8 = 0;
    for (iVar9 = 0; count != iVar9; iVar9 = iVar9 + 1) {
      psVar2 = update->sel->sel_vector;
      row_idx = iVar9;
      if (psVar2 != (sel_t *)0x0) {
        row_idx = (idx_t)psVar2[iVar9];
      }
      bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(update->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
      if (bVar4) {
        sel->sel_vector[iVar8] = (sel_t)iVar9;
        iVar8 = iVar8 + 1;
        uVar6 = *(ushort *)(pdVar1 + row_idx * 2);
        uVar7 = (ushort)*(undefined4 *)((long)&(stats->statistics).stats_union + 0x18);
        uVar5 = (ushort)*(undefined4 *)((long)&(stats->statistics).stats_union + 8);
        if (uVar6 <= uVar5) {
          uVar5 = uVar6;
        }
        *(ushort *)((long)&(stats->statistics).stats_union + 8) = uVar5;
        if (uVar6 < uVar7) {
          uVar6 = uVar7;
        }
        *(ushort *)((long)&(stats->statistics).stats_union + 0x18) = uVar6;
      }
    }
  }
  return iVar8;
}

Assistant:

idx_t TemplatedUpdateNumericStatistics(UpdateSegment *segment, SegmentStatistics &stats, UnifiedVectorFormat &update,
                                       idx_t count, SelectionVector &sel) {
	auto update_data = update.GetData<T>(update);
	auto &mask = update.validity;

	if (mask.AllValid()) {
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			stats.statistics.UpdateNumericStats<T>(update_data[idx]);
		}
		sel.Initialize(nullptr);
		return count;
	} else {
		idx_t not_null_count = 0;
		sel.Initialize(STANDARD_VECTOR_SIZE);
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			if (mask.RowIsValid(idx)) {
				sel.set_index(not_null_count++, i);
				stats.statistics.UpdateNumericStats<T>(update_data[idx]);
			}
		}
		return not_null_count;
	}
}